

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBucket.h
# Opt level: O0

void __thiscall
CTSL::
HashBucket<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
clear(HashBucket<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      *this)

{
  HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *pHVar1;
  HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_30;
  HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *node;
  HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *prev;
  unique_lock<std::shared_timed_mutex> lock;
  HashBucket<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::shared_timed_mutex>::unique_lock
            ((unique_lock<std::shared_timed_mutex> *)&prev,&this->mutex_);
  pHVar1 = this->head;
  while (local_30 = pHVar1,
        local_30 !=
        (HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)0x0) {
    pHVar1 = local_30->next;
    if (local_30 !=
        (HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)0x0) {
      HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      ::~HashNode(local_30);
      operator_delete(local_30,0x30);
    }
  }
  this->head = (HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)0x0;
  std::unique_lock<std::shared_timed_mutex>::~unique_lock
            ((unique_lock<std::shared_timed_mutex> *)&prev);
  return;
}

Assistant:

void clear()
  {
    // Exclusive lock to enable single write in the bucket
    std::unique_lock lock(mutex_);
    HashNode<K, V> *prev = nullptr;
    HashNode<K, V> *node = head;
    while (node != nullptr)
    {
      prev = node;
      node = node->next;
      delete prev;
    }
    head = nullptr;
  }